

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution1d.cpp
# Opt level: O3

float __thiscall embree::Distribution1D::pdf(Distribution1D *this,float p)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)((float)this->size * p);
  uVar1 = (int)this->size - 1;
  if ((int)uVar2 < (int)uVar1) {
    uVar1 = uVar2;
  }
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  return (this->PDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start[uVar2];
}

Assistant:

float Distribution1D::pdf(const float p) const {
    return PDF[clamp(int(p*size),0,int(size)-1)];
  }